

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclCon.h
# Opt level: O0

int Scl_ConParse(Scl_Con_t *p,Abc_Nam_t *pNamI,Abc_Nam_t *pNamO)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char *pStr;
  char *__nptr;
  void *pvVar4;
  double dVar5;
  FILE *pFile;
  int Value;
  int nLines;
  int Num;
  int i;
  char *pName;
  char *pToken3;
  char *pToken2;
  char *pToken;
  char Buffer [1000];
  Abc_Nam_t *pNamO_local;
  Abc_Nam_t *pNamI_local;
  Scl_Con_t *p_local;
  
  pFile._4_4_ = 0;
  Buffer._992_8_ = pNamO;
  __stream = fopen(p->pFileName,"rb");
  while (pcVar3 = fgets((char *)&pToken,1000,__stream), pcVar3 != (char *)0x0) {
    pFile._4_4_ = pFile._4_4_ + 1;
    pcVar3 = strtok((char *)&pToken," \t\r\n");
    if (pcVar3 != (char *)0x0) {
      pStr = strtok((char *)0x0," \t\r\n");
      if (pStr == (char *)0x0) {
        printf("Line %d: Skipping directive \"%s\" without argument.\n",(ulong)pFile._4_4_,pcVar3);
      }
      else {
        __nptr = strtok((char *)0x0," \t\r\n");
        iVar1 = strcmp(pcVar3,".model");
        if (iVar1 == 0) {
          pcVar3 = Abc_UtilStrsav(pStr);
          p->pModelName = pcVar3;
        }
        else {
          iVar1 = strcmp(pcVar3,".default_input_cell");
          if (iVar1 == 0) {
            pcVar3 = Abc_UtilStrsav(pStr);
            p->pInCellDef = pcVar3;
          }
          else {
            iVar1 = strcmp(pcVar3,".default_input_arrival");
            if (iVar1 == 0) {
              dVar5 = atof(pStr);
              iVar1 = Scl_Flt2Int((float)dVar5);
              p->tInArrDef = iVar1;
            }
            else {
              iVar1 = strcmp(pcVar3,".default_input_slew");
              if (iVar1 == 0) {
                dVar5 = atof(pStr);
                iVar1 = Scl_Flt2Int((float)dVar5);
                p->tInSlewDef = iVar1;
              }
              else {
                iVar1 = strcmp(pcVar3,".default_input_load");
                if (iVar1 == 0) {
                  dVar5 = atof(pStr);
                  iVar1 = Scl_Flt2Int((float)dVar5);
                  p->tInLoadDef = iVar1;
                }
                else {
                  iVar1 = strcmp(pcVar3,".default_output_required");
                  if (iVar1 == 0) {
                    dVar5 = atof(pStr);
                    iVar1 = Scl_Flt2Int((float)dVar5);
                    p->tOutReqDef = iVar1;
                  }
                  else {
                    iVar1 = strcmp(pcVar3,".default_output_load");
                    if (iVar1 == 0) {
                      dVar5 = atof(pStr);
                      iVar1 = Scl_Flt2Int((float)dVar5);
                      p->tOutLoadDef = iVar1;
                    }
                    else if (__nptr == (char *)0x0) {
                      printf("Directive %s should be followed by two arguments.\n",pcVar3);
                    }
                    else {
                      iVar1 = strcmp(pcVar3,".input_cell");
                      if (iVar1 == 0) {
                        iVar1 = Abc_NamStrFind(pNamI,pStr);
                        if (iVar1 < 1) {
                          printf("Line %d: Cannot find input \"%s\".\n",(ulong)pFile._4_4_,pStr);
                        }
                        else {
                          pcVar3 = Abc_UtilStrsav(__nptr);
                          Vec_PtrWriteEntry(&p->vInCells,iVar1 + -1,pcVar3);
                        }
                      }
                      else {
                        iVar1 = strcmp(pcVar3,".input_arrival");
                        if (iVar1 == 0) {
                          iVar1 = Abc_NamStrFind(pNamI,pStr);
                          if (iVar1 < 1) {
                            printf("Line %d: Cannot find input \"%s\".\n",(ulong)pFile._4_4_,pStr);
                          }
                          else {
                            dVar5 = atof(__nptr);
                            iVar2 = Scl_Flt2Int((float)dVar5);
                            Vec_IntWriteEntry(&p->vInArrs,iVar1 + -1,iVar2);
                          }
                        }
                        else {
                          iVar1 = strcmp(pcVar3,".input_slew");
                          if (iVar1 == 0) {
                            iVar1 = Abc_NamStrFind(pNamI,pStr);
                            if (iVar1 < 1) {
                              printf("Line %d: Cannot find input \"%s\".\n",(ulong)pFile._4_4_,pStr)
                              ;
                            }
                            else {
                              dVar5 = atof(__nptr);
                              iVar2 = Scl_Flt2Int((float)dVar5);
                              Vec_IntWriteEntry(&p->vInSlews,iVar1 + -1,iVar2);
                            }
                          }
                          else {
                            iVar1 = strcmp(pcVar3,".input_load");
                            if (iVar1 == 0) {
                              iVar1 = Abc_NamStrFind(pNamI,pStr);
                              if (iVar1 < 1) {
                                printf("Line %d: Cannot find input \"%s\".\n",(ulong)pFile._4_4_,
                                       pStr);
                              }
                              else {
                                dVar5 = atof(__nptr);
                                iVar2 = Scl_Flt2Int((float)dVar5);
                                Vec_IntWriteEntry(&p->vInLoads,iVar1 + -1,iVar2);
                              }
                            }
                            else {
                              iVar1 = strcmp(pcVar3,".output_required");
                              if (iVar1 == 0) {
                                iVar1 = Abc_NamStrFind((Abc_Nam_t *)Buffer._992_8_,pStr);
                                if (iVar1 < 1) {
                                  printf("Line %d: Cannot find output \"%s\".\n",(ulong)pFile._4_4_,
                                         pStr);
                                }
                                else {
                                  dVar5 = atof(__nptr);
                                  iVar2 = Scl_Flt2Int((float)dVar5);
                                  Vec_IntWriteEntry(&p->vOutReqs,iVar1 + -1,iVar2);
                                }
                              }
                              else {
                                iVar1 = strcmp(pcVar3,".output_load");
                                if (iVar1 == 0) {
                                  iVar1 = Abc_NamStrFind((Abc_Nam_t *)Buffer._992_8_,pStr);
                                  if (iVar1 < 1) {
                                    printf("Line %d: Cannot find output \"%s\".\n",
                                           (ulong)pFile._4_4_,pStr);
                                  }
                                  else {
                                    dVar5 = atof(__nptr);
                                    iVar2 = Scl_Flt2Int((float)dVar5);
                                    Vec_IntWriteEntry(&p->vOutLoads,iVar1 + -1,iVar2);
                                  }
                                }
                                else {
                                  printf("Line %d: Skipping unrecognized directive \"%s\".\n",
                                         (ulong)pFile._4_4_,pcVar3);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (p->pInCellDef == (char *)0x0) {
    p->pInCellDef = (char *)0x0;
  }
  if (p->tInArrDef == 0x3fffffff) {
    p->tInArrDef = 0;
  }
  if (p->tInSlewDef == 0x3fffffff) {
    p->tInSlewDef = 0;
  }
  if (p->tInLoadDef == 0x3fffffff) {
    p->tInLoadDef = 0;
  }
  if (p->tOutReqDef == 0x3fffffff) {
    p->tOutReqDef = 0;
  }
  if (p->tOutLoadDef == 0x3fffffff) {
    p->tOutLoadDef = 0;
  }
  if (p->pInCellDef != (char *)0x0) {
    for (nLines = 0; iVar1 = Vec_PtrSize(&p->vInCells), nLines < iVar1; nLines = nLines + 1) {
      pvVar4 = Vec_PtrEntry(&p->vInCells,nLines);
      if (pvVar4 == (void *)0x0) {
        pcVar3 = Abc_UtilStrsav(p->pInCellDef);
        Vec_PtrWriteEntry(&p->vInCells,nLines,pcVar3);
      }
    }
  }
  for (nLines = 0; iVar1 = Vec_IntSize(&p->vInArrs), nLines < iVar1; nLines = nLines + 1) {
    iVar1 = Vec_IntEntry(&p->vInArrs,nLines);
    if (iVar1 == 0x3fffffff) {
      Vec_IntWriteEntry(&p->vInArrs,nLines,p->tInArrDef);
    }
  }
  for (nLines = 0; iVar1 = Vec_IntSize(&p->vInSlews), nLines < iVar1; nLines = nLines + 1) {
    iVar1 = Vec_IntEntry(&p->vInSlews,nLines);
    if (iVar1 == 0x3fffffff) {
      Vec_IntWriteEntry(&p->vInSlews,nLines,p->tInSlewDef);
    }
  }
  for (nLines = 0; iVar1 = Vec_IntSize(&p->vInLoads), nLines < iVar1; nLines = nLines + 1) {
    iVar1 = Vec_IntEntry(&p->vInLoads,nLines);
    if (iVar1 == 0x3fffffff) {
      Vec_IntWriteEntry(&p->vInLoads,nLines,p->tInLoadDef);
    }
  }
  for (nLines = 0; iVar1 = Vec_IntSize(&p->vOutReqs), nLines < iVar1; nLines = nLines + 1) {
    iVar1 = Vec_IntEntry(&p->vOutReqs,nLines);
    if (iVar1 == 0x3fffffff) {
      Vec_IntWriteEntry(&p->vOutReqs,nLines,p->tOutReqDef);
    }
  }
  for (nLines = 0; iVar1 = Vec_IntSize(&p->vOutLoads), nLines < iVar1; nLines = nLines + 1) {
    iVar1 = Vec_IntEntry(&p->vOutLoads,nLines);
    if (iVar1 == 0x3fffffff) {
      Vec_IntWriteEntry(&p->vOutLoads,nLines,p->tOutLoadDef);
    }
  }
  fclose(__stream);
  return 1;
}

Assistant:

static inline int Scl_ConParse( Scl_Con_t * p, Abc_Nam_t * pNamI, Abc_Nam_t * pNamO )
{
    char Buffer[1000];
    char * pToken, * pToken2, * pToken3, * pName; 
    int i, Num = -1, nLines = 0; int Value;
    FILE * pFile = fopen( p->pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        nLines++;
        pToken = strtok( Buffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        pToken2 = strtok( NULL, " \t\r\n" );
        if ( pToken2 == NULL )
        {
            printf( "Line %d: Skipping directive \"%s\" without argument.\n", nLines, pToken );
            continue;
        }
        pToken3 = strtok( NULL, " \t\r\n" );
        if ( !strcmp(pToken, ".model") )                                p->pModelName  = Abc_UtilStrsav(pToken2);
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_INPUT_CELL)) )  p->pInCellDef  = Abc_UtilStrsav(pToken2);
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_INPUT_ARR))  )  p->tInArrDef   = Scl_Flt2Int(atof(pToken2));
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_INPUT_SLEW)) )  p->tInSlewDef  = Scl_Flt2Int(atof(pToken2));
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_INPUT_LOAD)) )  p->tInLoadDef  = Scl_Flt2Int(atof(pToken2));
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_OUTPUT_REQ)) )  p->tOutReqDef  = Scl_Flt2Int(atof(pToken2));
        else if ( !strcmp(pToken, SCL_DEF_DIRECTIVE(SCL_OUTPUT_LOAD)))  p->tOutLoadDef = Scl_Flt2Int(atof(pToken2));
        else if ( pToken3 == NULL ) { printf( "Directive %s should be followed by two arguments.\n", pToken ); continue; }
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_INPUT_CELL))  )     if ( (Num = Abc_NamStrFind(pNamI, pToken2)) > 0 )  Vec_PtrWriteEntry( &p->vInCells,  Num-1, Abc_UtilStrsav(pToken3) );    else printf( "Line %d: Cannot find input \"%s\".\n", nLines, pToken2 );
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_INPUT_ARR))   )     if ( (Num = Abc_NamStrFind(pNamI, pToken2)) > 0 )  Vec_IntWriteEntry( &p->vInArrs,   Num-1, Scl_Flt2Int(atof(pToken3)) ); else printf( "Line %d: Cannot find input \"%s\".\n", nLines, pToken2 );
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_INPUT_SLEW))  )     if ( (Num = Abc_NamStrFind(pNamI, pToken2)) > 0 )  Vec_IntWriteEntry( &p->vInSlews,  Num-1, Scl_Flt2Int(atof(pToken3)) ); else printf( "Line %d: Cannot find input \"%s\".\n", nLines, pToken2 );
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_INPUT_LOAD))  )     if ( (Num = Abc_NamStrFind(pNamI, pToken2)) > 0 )  Vec_IntWriteEntry( &p->vInLoads,  Num-1, Scl_Flt2Int(atof(pToken3)) ); else printf( "Line %d: Cannot find input \"%s\".\n", nLines, pToken2 );
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_OUTPUT_REQ))  )     if ( (Num = Abc_NamStrFind(pNamO, pToken2)) > 0 )  Vec_IntWriteEntry( &p->vOutReqs,  Num-1, Scl_Flt2Int(atof(pToken3)) ); else printf( "Line %d: Cannot find output \"%s\".\n", nLines, pToken2 );
        else if ( !strcmp(pToken, SCL_DIRECTIVE(SCL_OUTPUT_LOAD)) )     if ( (Num = Abc_NamStrFind(pNamO, pToken2)) > 0 )  Vec_IntWriteEntry( &p->vOutLoads, Num-1, Scl_Flt2Int(atof(pToken3)) ); else printf( "Line %d: Cannot find output \"%s\".\n", nLines, pToken2 );
        else printf( "Line %d: Skipping unrecognized directive \"%s\".\n", nLines, pToken );
    }
    // set missing defaults
    if ( p->pInCellDef  == NULL )          p->pInCellDef  = NULL; // consider using buffer from the current library
    if ( p->tInArrDef   == SCL_INFINITY )  p->tInArrDef   = 0;
    if ( p->tInSlewDef  == SCL_INFINITY )  p->tInSlewDef  = 0;
    if ( p->tInLoadDef  == SCL_INFINITY )  p->tInLoadDef  = 0;
    if ( p->tOutReqDef  == SCL_INFINITY )  p->tOutReqDef  = 0;
    if ( p->tOutLoadDef == SCL_INFINITY )  p->tOutLoadDef = 0;
    // set individual defaults
    if ( p->pInCellDef )
    Vec_PtrForEachEntry(char *, &p->vInCells, pName, i) if ( pName == NULL )          Vec_PtrWriteEntry( &p->vInCells,  i, Abc_UtilStrsav(p->pInCellDef) );
    Vec_IntForEachEntry( &p->vInArrs, Value, i )        if ( Value == SCL_INFINITY )  Vec_IntWriteEntry( &p->vInArrs,   i, p->tInArrDef );
    Vec_IntForEachEntry( &p->vInSlews, Value, i )       if ( Value == SCL_INFINITY )  Vec_IntWriteEntry( &p->vInSlews,  i, p->tInSlewDef );
    Vec_IntForEachEntry( &p->vInLoads, Value, i )       if ( Value == SCL_INFINITY )  Vec_IntWriteEntry( &p->vInLoads,  i, p->tInLoadDef );
    Vec_IntForEachEntry( &p->vOutReqs, Value, i )       if ( Value == SCL_INFINITY )  Vec_IntWriteEntry( &p->vOutReqs,  i, p->tOutReqDef );
    Vec_IntForEachEntry( &p->vOutLoads, Value, i )      if ( Value == SCL_INFINITY )  Vec_IntWriteEntry( &p->vOutLoads, i, p->tOutLoadDef );

    fclose( pFile );
    return 1;
}